

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_utils.c
# Opt level: O2

int64_t rml_encode_key(char *key,int64_t prime_number)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  sVar1 = strlen(key);
  if ((long)sVar1 < 1) {
    sVar1 = 0;
  }
  lVar4 = 1;
  uVar5 = 0;
  lVar6 = lVar4;
  lVar7 = lVar4;
  lVar8 = lVar4;
  while( true ) {
    if (sVar1 == uVar5) break;
    uVar3 = (ulong)(byte)key[uVar5];
    lVar8 = lVar8 + uVar3;
    uVar2 = 0;
    if ((uVar5 & 1) == 0) {
      uVar2 = uVar3;
    }
    lVar6 = lVar6 + uVar2;
    uVar2 = 0;
    if ((int)((uVar5 & 0xffffffff) / 3) * -3 + (int)uVar5 == 0) {
      uVar2 = uVar3;
    }
    lVar7 = lVar7 + uVar2;
    if ((uVar5 & 3) != 0) {
      uVar3 = 0;
    }
    lVar4 = lVar4 + uVar3;
    uVar5 = uVar5 + 1;
  }
  return (lVar4 * lVar8 * lVar7 * lVar6) % prime_number;
}

Assistant:

int64_t rml_encode_key(char *key, int64_t prime_number) {
    int64_t length = strlen(key);
    int64_t code1 = 1;
    int64_t code2 = 1;
    int64_t code3 = 1;
    int64_t code4 = 1;
    uint8_t current = 0;
    for (int i = 0; i < length; ++i) {
        current = key[i];
        code1 += current;
        if (i % 2 == 0) {
            code2 += current;
        }
        if (i % 3 == 0) {
            code3 += current;
        }
        if (i % 4 == 0) {
            code4 += current;
        }
    }
    int64_t code = (code1 * code2 * code3 * code4) % prime_number;
    return code;
}